

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

bool __thiscall
google::protobuf::Reflection::HasField(Reflection *this,Message *message,FieldDescriptor *field)

{
  byte bVar1;
  Descriptor *expected;
  bool bVar2;
  uint32_t uVar3;
  char *description;
  OneofDescriptor *oneof_descriptor;
  Metadata MVar4;
  
  MVar4 = Message::GetMetadata(message);
  if (MVar4.reflection != this) {
LAB_00297792:
    expected = this->descriptor_;
    MVar4 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(expected,MVar4.descriptor,field,"HasField");
  }
  if (field->containing_type_ == this->descriptor_) {
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
      HasField();
      goto LAB_00297792;
    }
    if ((bVar1 & 0x20) == 0) {
      if ((bVar1 & 8) != 0) {
        uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        bVar2 = internal::ExtensionSet::Has
                          ((ExtensionSet *)
                           ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                           field->number_);
        return bVar2;
      }
      bVar2 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
      if (bVar2) {
        if ((field->field_0x1 & 0x10) == 0) {
          oneof_descriptor = (OneofDescriptor *)0x0;
        }
        else {
          oneof_descriptor = (field->scope_).containing_oneof;
          if (oneof_descriptor == (OneofDescriptor *)0x0) {
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb31);
          }
        }
        uVar3 = GetOneofCase(this,message,oneof_descriptor);
        return uVar3 == field->number_;
      }
      bVar2 = HasFieldSingular(this,message,field);
      return bVar2;
    }
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(this->descriptor_,field,"HasField",description);
}

Assistant:

bool Reflection::HasField(const Message& message,
                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE(HasField, &message);
  USAGE_CHECK_MESSAGE_TYPE(HasField);
  USAGE_CHECK_SINGULAR(HasField);

  if (field->is_extension()) {
    return GetExtensionSet(message).Has(field->number());
  } else {
    if (schema_.InRealOneof(field)) {
      return HasOneofField(message, field);
    } else {
      return HasFieldSingular(message, field);
    }
  }
}